

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O1

void cjson_create_string_reference_should_create_a_string_reference(void)

{
  cJSON *item;
  
  item = (cJSON *)(*global_hooks.allocate)(0x40);
  if (item != (cJSON *)0x0) {
    item->child = (cJSON *)0x0;
    *(undefined8 *)&item->type = 0;
    item->valuestring = (char *)0x0;
    *(undefined8 *)&item->valueint = 0;
    item->valuedouble = 0.0;
    item->string = (char *)0x0;
    item->next = (cJSON *)0x0;
    item->prev = (cJSON *)0x0;
    item->type = 0x110;
    item->valuestring = "I am a string!";
  }
  if (item->valuestring != "I am a string!") {
    UnityFail(" Expected TRUE Was FALSE",0x1ec);
  }
  UnityAssertEqualNumber(0x110,(long)item->type,(char *)0x0,0x1ed,UNITY_DISPLAY_STYLE_INT);
  cJSON_Delete(item);
  return;
}

Assistant:

static void cjson_create_string_reference_should_create_a_string_reference(void) {
    const char *string = "I am a string!";

    cJSON *string_reference = cJSON_CreateStringReference(string);
    TEST_ASSERT_TRUE(string_reference->valuestring == string);
    TEST_ASSERT_EQUAL_INT(cJSON_IsReference | cJSON_String, string_reference->type);

    cJSON_Delete(string_reference);
}